

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O1

void __thiscall
dtc::fdt::device_tree::reassign_fragment_numbers(device_tree *this,node_ptr *node,int *delta)

{
  element_type *peVar1;
  pointer psVar2;
  size_t __n;
  long *__nptr;
  int iVar3;
  int *piVar4;
  long lVar5;
  undefined8 uVar6;
  char *__end;
  int iVar7;
  pointer psVar8;
  bool bVar9;
  ostringstream new_address;
  long *local_1c8 [2];
  long local_1b8 [2];
  long *local_1a8;
  size_t local_1a0;
  long local_198;
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  peVar1 = (node->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  psVar8 = (peVar1->children).
           super__Vector_base<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (peVar1->children).
           super__Vector_base<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (psVar8 == psVar2) {
      return;
    }
    peVar1 = (psVar8->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_1a8 = &local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"fragment","");
    __n = (peVar1->name)._M_string_length;
    if (__n == local_1a0) {
      if (__n == 0) {
        bVar9 = true;
      }
      else {
        iVar3 = bcmp((peVar1->name)._M_dataplus._M_p,local_1a8,__n);
        bVar9 = iVar3 == 0;
      }
    }
    else {
      bVar9 = false;
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if (bVar9) {
      __nptr = (long *)(((psVar8->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->unit_address)._M_dataplus._M_p;
      piVar4 = __errno_location();
      iVar3 = *piVar4;
      *piVar4 = 0;
      lVar5 = strtol((char *)__nptr,(char **)&local_1a8,0x10);
      if (local_1a8 == __nptr) {
        std::__throw_invalid_argument("stoi");
LAB_00128f17:
        uVar6 = std::__throw_out_of_range("stoi");
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        _Unwind_Resume(uVar6);
      }
      iVar7 = (int)lVar5;
      if ((iVar7 != lVar5) || (*piVar4 == 0x22)) goto LAB_00128f17;
      if (*piVar4 == 0) {
        *piVar4 = iVar3;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      iVar3 = *delta;
      *delta = iVar3 + iVar7 + 1;
      *(uint *)((long)auStack_190 + local_1a8[-3]) =
           *(uint *)((long)auStack_190 + local_1a8[-3]) & 0xffffffb5 | 8;
      std::ostream::operator<<((ostream *)&local_1a8,iVar3 + iVar7);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=
                ((string *)
                 &((psVar8->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->unit_address,(string *)local_1c8);
      if (local_1c8[0] != local_1b8) {
        operator_delete(local_1c8[0],local_1b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    psVar8 = psVar8 + 1;
  } while( true );
}

Assistant:

void
device_tree::reassign_fragment_numbers(node_ptr &node, int &delta)
{

	for (auto &c : node->child_nodes())
	{
		if (c->name == std::string("fragment"))
		{
			int current_address = std::stoi(c->unit_address, nullptr, 16);
			std::ostringstream new_address;
			current_address += delta;
			// It's possible that we hopped more than one somewhere, so just reset
			// delta to the next in sequence.
			delta = current_address + 1;
			new_address << std::hex << current_address;
			c->unit_address = new_address.str();
		}
	}
}